

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.h
# Opt level: O2

cmCommand * __thiscall cmFLTKWrapUICommand::Clone(cmFLTKWrapUICommand *this)

{
  cmFLTKWrapUICommand *this_00;
  
  this_00 = (cmFLTKWrapUICommand *)operator_new(0x68);
  cmFLTKWrapUICommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmFLTKWrapUICommand; }